

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

void __thiscall FIX::DataDictionary::readFromDocument(DataDictionary *this,DOMDocumentPtr *pDoc)

{
  _Alloc_hider _Var1;
  char cVar2;
  int iVar3;
  int iVar4;
  Type type_00;
  long *plVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  ConfigError *pCVar6;
  ulong *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  pointer *__ptr;
  DOMDocument *pDVar10;
  string *pDoc_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  DataDictionary *pDVar12;
  bool bVar13;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string description;
  string type_1;
  string type;
  string major;
  DOMAttributesPtr attrs_1;
  DOMNodePtr pMessageFieldNode;
  string number;
  DOMNodePtr pFieldNode;
  DOMNodePtr pMessageNode;
  DOMNodePtr pMessagesNode;
  DOMNodePtr pFieldValueNode;
  DOMNodePtr pHeaderFieldNode;
  string minor;
  DOMAttributesPtr attrs;
  DOMAttributesPtr attrs_8;
  DOMAttributesPtr attrs_7;
  DOMNodePtr pFieldsNode;
  DOMNodePtr pFixNode;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  string local_110;
  DataDictionary *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  DOMDocumentPtr *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  long *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  MsgTypeToField *local_40;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_38;
  
  pDVar10 = (pDoc->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  paVar8 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar8;
  local_b0 = pDoc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/fix","");
  (*pDVar10->_vptr_DOMDocument[5])(&local_48,pDVar10,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar8) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_48 == (long *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_178._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,
               "Could not parse data dictionary file, or no <fix> node found at root","");
    ConfigError::ConfigError(pCVar6,&local_178);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_48 + 0x20))(&local_68);
  local_178._M_dataplus._M_p = (pointer)paVar8;
  local_f0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"FIX","");
  plVar5 = local_68;
  paVar8 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"type","");
  cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_158,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar8) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if (((cVar2 != '\0') && (iVar3 = std::__cxx11::string::compare((char *)&local_178), iVar3 != 0))
     && (iVar3 = std::__cxx11::string::compare((char *)&local_178), iVar3 != 0)) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_158._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"type attribute must be FIX or FIXT","");
    ConfigError::ConfigError(pCVar6,&local_158);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  plVar5 = local_68;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"major","");
  cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_88,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  plVar5 = local_68;
  if (cVar2 == '\0') {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"major attribute not found on <fix>","");
    ConfigError::ConfigError(pCVar6,&local_88);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"minor","");
  cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_1f8,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 == '\0') {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"minor attribute not found on <fix>","");
    ConfigError::ConfigError(pCVar6,&local_1f8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  std::__cxx11::string::append((char *)&local_1d8);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,(ulong)local_158._M_dataplus._M_p);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_198.field_2._M_allocated_capacity = *puVar7;
    local_198.field_2._8_8_ = plVar5[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar7;
    local_198._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_198._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_110.field_2._M_allocated_capacity = *puVar7;
    local_110.field_2._8_8_ = plVar5[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar7;
    local_110._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_110._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_88._M_dataplus._M_p);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1f8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_1f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1f8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1f8._M_string_length = plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  setVersion(local_f0,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pDVar10 = (local_b0->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/fix/fields","");
  (*pDVar10->_vptr_DOMDocument[5])(&local_50,pDVar10,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_50 == (long *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"<fields> section not found in data dictionary","");
    ConfigError::ConfigError(pCVar6,&local_1f8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_50 + 0x10))(&local_e8);
  if (local_e8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"No fields defined","");
    ConfigError::ConfigError(pCVar6,&local_1f8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  if (local_e8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_40 = (MsgTypeToField *)&local_f0->m_fieldValues;
    do {
      (**(code **)(local_e8->_M_allocated_capacity + 0x28))(&local_1f8);
      iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        (**(code **)(local_e8->_M_allocated_capacity + 0x20))(&local_138);
        _Var1._M_p = local_138._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_allocated_capacity =
             local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"name","");
        iVar3 = (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_110,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        _Var1._M_p = local_138._M_dataplus._M_p;
        if ((char)iVar3 == '\0') {
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"<field> does not have a name attribute","");
          ConfigError::ConfigError(pCVar6,&local_110);
          __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_allocated_capacity =
             local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"number","");
        iVar3 = (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_198,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((char)iVar3 == '\0') {
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::operator+(&local_1d8,"<field> ",&local_1f8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d8);
          local_198._M_dataplus._M_p = (pointer)*plVar5;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_198._M_dataplus._M_p == psVar9) {
            local_198.field_2._M_allocated_capacity = *psVar9;
            local_198.field_2._8_8_ = plVar5[3];
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          }
          else {
            local_198.field_2._M_allocated_capacity = *psVar9;
          }
          local_198._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ConfigError::ConfigError(pCVar6,&local_198);
          __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        iVar3 = atoi(local_110._M_dataplus._M_p);
        _Var1._M_p = local_138._M_dataplus._M_p;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        local_198._M_string_length = 0;
        local_198.field_2._M_allocated_capacity =
             local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"type","");
        iVar4 = (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_1d8,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        pDVar12 = local_f0;
        if ((char)iVar4 == '\0') {
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          std::operator+(&local_1b8,"<field> ",&local_1f8);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          local_1d8._M_dataplus._M_p = (pointer)*plVar5;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_1d8._M_dataplus._M_p == psVar9) {
            local_1d8.field_2._M_allocated_capacity = *psVar9;
            local_1d8.field_2._8_8_ = plVar5[3];
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          }
          else {
            local_1d8.field_2._M_allocated_capacity = *psVar9;
          }
          local_1d8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          ConfigError::ConfigError(pCVar6,&local_1d8);
          __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        addField(local_f0,iVar3);
        type_00 = XMLTypeToType(pDVar12,&local_198);
        addFieldType(pDVar12,iVar3,type_00);
        addFieldName(pDVar12,iVar3,&local_1f8);
        (**(code **)(local_e8->_M_allocated_capacity + 0x10))(local_d0);
        while (local_d0[0] !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) {
          (**(code **)(local_d0[0]->_M_allocated_capacity + 0x28))(&local_1d8);
          iVar4 = std::__cxx11::string::compare((char *)&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if (iVar4 == 0) {
            (**(code **)(local_d0[0]->_M_allocated_capacity + 0x20))(&local_d8);
            plVar5 = local_d8;
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            local_1d8._M_string_length = 0;
            local_1d8.field_2._M_allocated_capacity =
                 local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"enum","");
            cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_1b8,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
            }
            if (cVar2 == '\0') {
              pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
              std::operator+(&local_1b8,"<value> does not have enum attribute in field ",&local_1f8)
              ;
              ConfigError::ConfigError(pCVar6,&local_1b8);
              __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
            }
            local_1b8._M_dataplus._M_p._0_4_ = iVar3;
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)std::
                         map<int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[]((map<int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       *)local_40,(key_type *)&local_1b8);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>(this_00,&local_1d8);
            plVar5 = local_d8;
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            local_1b8._M_string_length = 0;
            local_1b8.field_2._M_local_buf[0] = '\0';
            local_a8[0] = &local_98;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"description","");
            cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,(string *)local_a8,&local_1b8);
            if (local_a8[0] != &local_98) {
              operator_delete(local_a8[0],local_98._M_allocated_capacity + 1);
            }
            if (cVar2 != '\0') {
              addValueName(local_f0,iVar3,&local_1d8,&local_1b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_d8 != (long *)0x0) {
              (**(code **)(*local_d8 + 8))();
            }
          }
          (**(code **)(local_d0[0]->_M_allocated_capacity + 0x18))(&local_1d8);
          paVar8 = local_d0[0];
          local_d0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p;
          local_1d8._M_dataplus._M_p = (pointer)0x0;
          if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
            (**(code **)(paVar8->_M_allocated_capacity + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_1d8._M_dataplus._M_p + 8))();
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
        }
      }
      (**(code **)(local_e8->_M_allocated_capacity + 0x18))(&local_1f8);
      paVar8 = local_e8;
      local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f8._M_dataplus._M_p;
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        (**(code **)(paVar8->_M_allocated_capacity + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
      }
    } while (local_e8 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_178);
  pDVar12 = local_f0;
  paVar8 = &local_1f8.field_2;
  if ((iVar3 == 0) ||
     ((iVar3 = std::__cxx11::string::compare((char *)&local_178), iVar3 == 0 &&
      (iVar3 = std::__cxx11::string::compare((char *)&local_158), iVar3 < 0)))) {
    pDVar10 = (local_b0->_M_t).
              super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
              super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
              super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    local_1f8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/fix/header","");
    (*pDVar10->_vptr_DOMDocument[5])(&local_1b8,pDVar10,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar8) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1f8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"<header> section not found in data dictionary","");
      ConfigError::ConfigError(pCVar6,&local_1f8);
      __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 0x10))(local_a8);
    if (local_a8[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"No header fields defined","");
      ConfigError::ConfigError(pCVar6,&local_1f8);
      __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    if (local_a8[0] !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      do {
        (**(code **)(local_a8[0]->_M_allocated_capacity + 0x28))(&local_1f8);
        iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
        if (iVar3 == 0) {
          bVar13 = true;
        }
        else {
          (**(code **)(local_a8[0]->_M_allocated_capacity + 0x28))(&local_110);
          iVar3 = std::__cxx11::string::compare((char *)&local_110);
          bVar13 = iVar3 == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (bVar13) {
          (**(code **)(local_a8[0]->_M_allocated_capacity + 0x20))(&local_138);
          _Var1._M_p = local_138._M_dataplus._M_p;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          local_1f8._M_string_length = 0;
          local_1f8.field_2._M_allocated_capacity =
               local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"name","");
          iVar3 = (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_198,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          _Var1._M_p = local_138._M_dataplus._M_p;
          if ((char)iVar3 == '\0') {
            pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_198,"<field> does not have a name attribute","");
            ConfigError::ConfigError(pCVar6,&local_198);
            __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length = 0;
          local_198.field_2._M_allocated_capacity =
               local_198.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"required","");
          (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_1d8,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          pDVar10 = (DOMDocument *)0x1c7896;
          iVar3 = std::__cxx11::string::compare((char *)&local_198);
          if (iVar3 == 0) {
            bVar13 = true;
          }
          else {
            pDVar10 = (DOMDocument *)0x1d18b1;
            iVar3 = std::__cxx11::string::compare((char *)&local_198);
            bVar13 = iVar3 == 0;
          }
          iVar3 = lookupXMLFieldNumber(pDVar12,pDVar10,&local_1f8);
          addHeaderField(pDVar12,iVar3,bVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
          }
        }
        (**(code **)(local_a8[0]->_M_allocated_capacity + 0x28))(&local_1f8);
        iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (**(code **)(local_a8[0]->_M_allocated_capacity + 0x20))(&local_1d8);
          _Var1._M_p = local_1d8._M_dataplus._M_p;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          local_1f8._M_string_length = 0;
          local_1f8.field_2._M_allocated_capacity =
               local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"required","");
          (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_198,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
          if (iVar3 == 0) {
            bVar13 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
            bVar13 = iVar3 == 0;
          }
          paVar8 = local_a8[0];
          pDVar10 = (local_b0->_M_t).
                    super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                    .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"_header_","");
          pDVar12 = local_f0;
          addXMLGroup(local_f0,pDVar10,(DOMNode *)&paVar8->_M_allocated_capacity,&local_198,local_f0
                      ,bVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_1d8._M_dataplus._M_p + 8))();
          }
        }
        (**(code **)(local_a8[0]->_M_allocated_capacity + 0x18))(&local_1f8);
        paVar8 = local_a8[0];
        local_a8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f8._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
          (**(code **)(paVar8->_M_allocated_capacity + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
        }
      } while (local_a8[0] !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
    }
  }
  paVar8 = &local_1f8.field_2;
  iVar3 = std::__cxx11::string::compare((char *)&local_178);
  if ((iVar3 == 0) ||
     ((iVar3 = std::__cxx11::string::compare((char *)&local_178), iVar3 == 0 &&
      (iVar3 = std::__cxx11::string::compare((char *)&local_158), iVar3 < 0)))) {
    pDVar10 = (local_b0->_M_t).
              super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
              super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
              super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
    local_1f8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/fix/trailer","");
    (*pDVar10->_vptr_DOMDocument[5])(local_a8,pDVar10,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar8) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1f8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"<trailer> section not found in data dictionary","");
      ConfigError::ConfigError(pCVar6,&local_1f8);
      __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    (**(code **)(local_a8[0]->_M_allocated_capacity + 0x10))(&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"No trailer fields defined","");
      ConfigError::ConfigError(pCVar6,&local_1f8);
      __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      do {
        (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x28))(&local_1f8);
        iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
        if (iVar3 == 0) {
          bVar13 = true;
        }
        else {
          (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x28))(&local_198);
          iVar3 = std::__cxx11::string::compare((char *)&local_198);
          bVar13 = iVar3 == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (bVar13) {
          (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x20))(local_d0);
          paVar8 = local_d0[0];
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          local_1f8._M_string_length = 0;
          local_1f8.field_2._M_allocated_capacity =
               local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"name","");
          cVar2 = (**(code **)(paVar8->_M_allocated_capacity + 0x10))(paVar8,&local_1d8,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          paVar8 = local_d0[0];
          if (cVar2 == '\0') {
            pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1d8,"<field> does not have a name attribute","");
            ConfigError::ConfigError(pCVar6,&local_1d8);
            __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          local_1d8._M_string_length = 0;
          local_1d8.field_2._M_allocated_capacity =
               local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"required","");
          (**(code **)(paVar8->_M_allocated_capacity + 0x10))(paVar8,&local_1b8,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          pDVar10 = (DOMDocument *)0x1c7896;
          iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
          if (iVar3 == 0) {
            bVar13 = true;
          }
          else {
            pDVar10 = (DOMDocument *)0x1d18b1;
            iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
            bVar13 = iVar3 == 0;
          }
          iVar3 = lookupXMLFieldNumber(pDVar12,pDVar10,&local_1f8);
          addTrailerField(pDVar12,iVar3,bVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if (local_d0[0] !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(local_d0[0]->_M_allocated_capacity + 8))();
          }
        }
        (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x28))(&local_1f8);
        iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x20))(&local_1b8);
          _Var1._M_p = local_1b8._M_dataplus._M_p;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          local_1f8._M_string_length = 0;
          local_1f8.field_2._M_allocated_capacity =
               local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"required","");
          (**(code **)(*(size_type *)_Var1._M_p + 0x10))(_Var1._M_p,&local_1d8,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
          if (iVar3 == 0) {
            bVar13 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
            bVar13 = iVar3 == 0;
          }
          _Var1._M_p = local_138._M_dataplus._M_p;
          pDVar10 = (local_b0->_M_t).
                    super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                    .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"_trailer_","");
          pDVar12 = local_f0;
          addXMLGroup(local_f0,pDVar10,(DOMNode *)_Var1._M_p,&local_1d8,local_f0,bVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
          }
        }
        (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 0x18))(&local_1f8);
        _Var1._M_p = local_138._M_dataplus._M_p;
        local_138._M_dataplus._M_p = local_1f8._M_dataplus._M_p;
        local_1f8._M_dataplus._M_p = (pointer)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)_Var1._M_p + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
        }
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_138._M_dataplus._M_p !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
    if (local_a8[0] !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(local_a8[0]->_M_allocated_capacity + 8))();
    }
  }
  paVar8 = &local_1f8.field_2;
  pDVar10 = (local_b0->_M_t).
            super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>._M_t.
            super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>.
            super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl;
  local_1f8._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/fix/messages","");
  (*pDVar10->_vptr_DOMDocument[5])(&local_d8,pDVar10,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar8) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 == (long *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1f8._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"<messages> section not found in data dictionary","");
    ConfigError::ConfigError(pCVar6,&local_1f8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  (**(code **)(*local_d8 + 0x10))(&local_e0);
  if (local_e0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"No messages defined","");
    ConfigError::ConfigError(pCVar6,&local_1f8);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  if (local_e0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_38 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_f0->m_messages;
    local_40 = &local_f0->m_requiredFields;
    do {
      (**(code **)(local_e0->_M_allocated_capacity + 0x28))();
      iVar3 = std::__cxx11::string::compare((char *)&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        (**(code **)(local_e0->_M_allocated_capacity + 0x20))(&local_58);
        plVar5 = local_58;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_allocated_capacity =
             local_1f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"msgtype","");
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_1d8,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (cVar2 == '\0') {
          pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d8,"<message> does not have a msgtype attribute","");
          ConfigError::ConfigError(pCVar6,&local_1d8);
          __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_38,&local_1f8);
        plVar5 = local_58;
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_allocated_capacity =
             local_1d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"name","");
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_1b8,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                   local_1b8.field_2._M_local_buf[0]) + 1);
        }
        if (cVar2 != '\0') {
          addValueName(local_f0,0x23,&local_1f8,&local_1d8);
        }
        (**(code **)(local_e0->_M_allocated_capacity + 0x10))(&local_118);
        while (paVar8 = &local_1b8.field_2,
              local_118 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
          (**(code **)(local_118->_M_allocated_capacity + 0x28))(&local_1b8);
          iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
          if (iVar3 == 0) {
            bVar13 = true;
          }
          else {
            (**(code **)(local_118->_M_allocated_capacity + 0x28))(local_a8);
            iVar3 = std::__cxx11::string::compare((char *)local_a8);
            bVar13 = iVar3 == 0;
            if (local_a8[0] != &local_98) {
              operator_delete(local_a8[0],local_98._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar8) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          if (bVar13) {
            (**(code **)(local_118->_M_allocated_capacity + 0x20))(&local_60);
            paVar11 = local_60;
            local_1b8._M_string_length = 0;
            local_1b8.field_2._M_local_buf[0] = '\0';
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_1b8._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"name","");
            pDoc_00 = &local_138;
            cVar2 = (**(code **)(paVar11->_M_allocated_capacity + 0x10))
                              (paVar11,&local_138,&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              pDoc_00 = (string *)
                        (CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                  local_138.field_2._M_local_buf[0]) + 1);
              operator_delete(local_138._M_dataplus._M_p,(ulong)pDoc_00);
            }
            pDVar12 = local_f0;
            if (cVar2 == '\0') {
              pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"<field> does not have a name attribute","");
              ConfigError::ConfigError(pCVar6,&local_138);
              __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
            }
            iVar3 = lookupXMLFieldNumber(local_f0,(DOMDocument *)pDoc_00,&local_1b8);
            addMsgField(pDVar12,&local_1f8,iVar3);
            paVar8 = local_60;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_138._M_string_length = 0;
            local_138.field_2._M_local_buf[0] = '\0';
            local_d0[0] = &local_c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"required","");
            cVar2 = (**(code **)(paVar8->_M_allocated_capacity + 0x10))
                              (paVar8,(string *)local_d0,&local_138);
            if (cVar2 == '\0') {
              if (local_d0[0] != &local_c0) {
                operator_delete(local_d0[0],local_c0._M_allocated_capacity + 1);
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_138);
              if (iVar4 == 0) {
                if (local_d0[0] != &local_c0) {
                  operator_delete(local_d0[0],local_c0._M_allocated_capacity + 1);
                }
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_138);
                if (local_d0[0] != &local_c0) {
                  operator_delete(local_d0[0],local_c0._M_allocated_capacity + 1);
                }
                if (iVar4 != 0) goto LAB_0015cdbe;
              }
              local_d0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_d0[0]._4_4_,iVar3);
              this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        ::operator[](local_40,&local_1f8);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(this_01,(int *)local_d0);
            }
LAB_0015cdbe:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
            paVar11 = local_60;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
              paVar11 = local_60;
            }
LAB_0015ce4f:
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(paVar11->_M_allocated_capacity + 8))();
            }
          }
          else {
            (**(code **)(local_118->_M_allocated_capacity + 0x28))(&local_1b8);
            iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != paVar8) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
            }
            if (iVar3 == 0) {
              (**(code **)(local_118->_M_allocated_capacity + 0x20))(local_d0);
              paVar11 = local_d0[0];
              local_1b8._M_string_length = 0;
              local_1b8.field_2._M_local_buf[0] = '\0';
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              local_1b8._M_dataplus._M_p = (pointer)paVar8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"required","");
              (**(code **)(paVar11->_M_allocated_capacity + 0x10))(paVar11,&local_138,&local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                         local_138.field_2._M_local_buf[0]) + 1);
              }
              iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
              if (iVar3 == 0) {
                bVar13 = true;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
                bVar13 = iVar3 == 0;
              }
              addXMLComponentFields
                        (local_f0,(local_b0->_M_t).
                                  super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                  .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,
                         (DOMNode *)&local_118->_M_allocated_capacity,&local_1f8,local_f0,bVar13);
              paVar11 = local_d0[0];
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != paVar8) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                         local_1b8.field_2._M_local_buf[0]) + 1);
                paVar11 = local_d0[0];
              }
              goto LAB_0015ce4f;
            }
          }
          paVar8 = &local_1b8.field_2;
          (**(code **)(local_118->_M_allocated_capacity + 0x28))(&local_1b8);
          iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != paVar8) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                     local_1b8.field_2._M_local_buf[0]) + 1);
          }
          if (iVar3 == 0) {
            (**(code **)(local_118->_M_allocated_capacity + 0x20))(local_d0);
            paVar11 = local_d0[0];
            local_1b8._M_string_length = 0;
            local_1b8.field_2._M_local_buf[0] = '\0';
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_1b8._M_dataplus._M_p = (pointer)paVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"required","");
            (**(code **)(paVar11->_M_allocated_capacity + 0x10))(paVar11,&local_138,&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
            iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
            if (iVar3 == 0) {
              bVar13 = true;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
              bVar13 = iVar3 == 0;
            }
            addXMLGroup(local_f0,(local_b0->_M_t).
                                 super___uniq_ptr_impl<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_FIX::DOMDocument_*,_std::default_delete<FIX::DOMDocument>_>
                                 .super__Head_base<0UL,_FIX::DOMDocument_*,_false>._M_head_impl,
                        (DOMNode *)&local_118->_M_allocated_capacity,&local_1f8,local_f0,bVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != paVar8) {
              operator_delete(local_1b8._M_dataplus._M_p,
                              CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                                       local_1b8.field_2._M_local_buf[0]) + 1);
            }
            if (local_d0[0] !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(local_d0[0]->_M_allocated_capacity + 8))();
            }
          }
          (**(code **)(local_118->_M_allocated_capacity + 0x18))(&local_1b8);
          paVar8 = local_118;
          local_118 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b8._M_dataplus._M_p;
          local_1b8._M_dataplus._M_p = (pointer)0x0;
          if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
            (**(code **)(paVar8->_M_allocated_capacity + 8))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (local_58 != (long *)0x0) {
          (**(code **)(*local_58 + 8))();
        }
      }
      (**(code **)(local_e0->_M_allocated_capacity + 0x18))(&local_1f8);
      paVar8 = local_e0;
      local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f8._M_dataplus._M_p;
      local_1f8._M_dataplus._M_p = (pointer)0x0;
      if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        (**(code **)(paVar8->_M_allocated_capacity + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_1f8._M_dataplus._M_p + 8))();
      }
    } while (local_e0 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  if (local_d8 != (long *)0x0) {
    (**(code **)(*local_d8 + 8))();
  }
  if (local_e8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(local_e8->_M_allocated_capacity + 8))();
  }
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (long *)0x0) {
    (**(code **)(*local_68 + 8))();
  }
  if (local_48 != (long *)0x0) {
    (**(code **)(*local_48 + 8))();
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  // VERSION
  DOMNodePtr pFixNode = pDoc->getNode("/fix");
  if (!pFixNode.get()) {
    throw ConfigError("Could not parse data dictionary file"
                      ", or no <fix> node found at root");
  }
  DOMAttributesPtr attrs = pFixNode->getAttributes();
  std::string type = "FIX";
  if (attrs->get("type", type)) {
    if (type != "FIX" && type != "FIXT") {
      throw ConfigError("type attribute must be FIX or FIXT");
    }
  }
  std::string major;
  if (!attrs->get("major", major)) {
    throw ConfigError("major attribute not found on <fix>");
  }
  std::string minor;
  if (!attrs->get("minor", minor)) {
    throw ConfigError("minor attribute not found on <fix>");
  }
  setVersion(type + "." + major + "." + minor);

  // FIELDS
  DOMNodePtr pFieldsNode = pDoc->getNode("/fix/fields");
  if (!pFieldsNode.get()) {
    throw ConfigError("<fields> section not found in data dictionary");
  }

  DOMNodePtr pFieldNode = pFieldsNode->getFirstChildNode();
  if (!pFieldNode.get()) {
    throw ConfigError("No fields defined");
  }

  while (pFieldNode.get()) {
    if (pFieldNode->getName() == "field") {
      DOMAttributesPtr attrs = pFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("<field> does not have a name attribute");
      }
      std::string number;
      if (!attrs->get("number", number)) {
        throw ConfigError("<field> " + name + " does not have a number attribute");
      }
      int num = atoi(number.c_str());
      std::string type;
      if (!attrs->get("type", type)) {
        throw ConfigError("<field> " + name + " does not have a type attribute");
      }
      addField(num);
      addFieldType(num, XMLTypeToType(type));
      addFieldName(num, name);

      DOMNodePtr pFieldValueNode = pFieldNode->getFirstChildNode();
      while (pFieldValueNode.get()) {
        if (pFieldValueNode->getName() == "value") {
          DOMAttributesPtr attrs = pFieldValueNode->getAttributes();
          std::string enumeration;
          if (!attrs->get("enum", enumeration)) {
            throw ConfigError("<value> does not have enum attribute in field " + name);
          }
          addFieldValue(num, enumeration);
          std::string description;
          if (attrs->get("description", description)) {
            addValueName(num, enumeration, description);
          }
        }
        RESET_AUTO_PTR(pFieldValueNode, pFieldValueNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pFieldNode, pFieldNode->getNextSiblingNode());
  }

  // HEADER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pHeaderNode = pDoc->getNode("/fix/header");
    if (!pHeaderNode.get()) {
      throw ConfigError("<header> section not found in data dictionary");
    }

    DOMNodePtr pHeaderFieldNode = pHeaderNode->getFirstChildNode();
    if (!pHeaderFieldNode.get()) {
      throw ConfigError("No header fields defined");
    }

    while (pHeaderFieldNode.get()) {
      if (pHeaderFieldNode->getName() == "field" || pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addHeaderField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pHeaderFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pHeaderFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pHeaderFieldNode.get(), "_header_", *this, isRequired);
      }

      RESET_AUTO_PTR(pHeaderFieldNode, pHeaderFieldNode->getNextSiblingNode());
    }
  }

  // TRAILER
  if (type == "FIXT" || (type == "FIX" && major < "5")) {
    DOMNodePtr pTrailerNode = pDoc->getNode("/fix/trailer");
    if (!pTrailerNode.get()) {
      throw ConfigError("<trailer> section not found in data dictionary");
    }

    DOMNodePtr pTrailerFieldNode = pTrailerNode->getFirstChildNode();
    if (!pTrailerFieldNode.get()) {
      throw ConfigError("No trailer fields defined");
    }

    while (pTrailerFieldNode.get()) {
      if (pTrailerFieldNode->getName() == "field" || pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string name;
        if (!attrs->get("name", name)) {
          throw ConfigError("<field> does not have a name attribute");
        }
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addTrailerField(lookupXMLFieldNumber(pDoc.get(), name), isRequired);
      }
      if (pTrailerFieldNode->getName() == "group") {
        DOMAttributesPtr attrs = pTrailerFieldNode->getAttributes();
        std::string required;
        attrs->get("required", required);
        bool isRequired = (required == "Y" || required == "y");
        addXMLGroup(pDoc.get(), pTrailerFieldNode.get(), "_trailer_", *this, isRequired);
      }

      RESET_AUTO_PTR(pTrailerFieldNode, pTrailerFieldNode->getNextSiblingNode());
    }
  }

  // MSGTYPE
  DOMNodePtr pMessagesNode = pDoc->getNode("/fix/messages");
  if (!pMessagesNode.get()) {
    throw ConfigError("<messages> section not found in data dictionary");
  }

  DOMNodePtr pMessageNode = pMessagesNode->getFirstChildNode();
  if (!pMessageNode.get()) {
    throw ConfigError("No messages defined");
  }

  while (pMessageNode.get()) {
    if (pMessageNode->getName() == "message") {
      DOMAttributesPtr attrs = pMessageNode->getAttributes();
      std::string msgtype;
      if (!attrs->get("msgtype", msgtype)) {
        throw ConfigError("<message> does not have a msgtype attribute");
      }
      addMsgType(msgtype);

      std::string name;
      if (attrs->get("name", name)) {
        addValueName(35, msgtype, name);
      }

      DOMNodePtr pMessageFieldNode = pMessageNode->getFirstChildNode();
      while (pMessageFieldNode.get()) {
        if (pMessageFieldNode->getName() == "field" || pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string name;
          if (!attrs->get("name", name)) {
            throw ConfigError("<field> does not have a name attribute");
          }
          int num = lookupXMLFieldNumber(pDoc.get(), name);
          addMsgField(msgtype, num);

          std::string required;
          if (attrs->get("required", required) && (required == "Y" || required == "y")) {
            addRequiredField(msgtype, num);
          }
        } else if (pMessageFieldNode->getName() == "component") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLComponentFields(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        if (pMessageFieldNode->getName() == "group") {
          DOMAttributesPtr attrs = pMessageFieldNode->getAttributes();
          std::string required;
          attrs->get("required", required);
          bool isRequired = (required == "Y" || required == "y");
          addXMLGroup(pDoc.get(), pMessageFieldNode.get(), msgtype, *this, isRequired);
        }
        RESET_AUTO_PTR(pMessageFieldNode, pMessageFieldNode->getNextSiblingNode());
      }
    }
    RESET_AUTO_PTR(pMessageNode, pMessageNode->getNextSiblingNode());
  }
}